

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUtils.h
# Opt level: O0

void csrFileTest(string *f1)

{
  int row;
  Matrix *pMVar1;
  CSR *this;
  Matrix *pMVar2;
  TriangularSolve *this_00;
  ostream *poVar3;
  rep_conflict rVar4;
  bool r2;
  Matrix *rs3;
  double durationSym;
  rep_conflict local_2c8;
  rep_conflict local_2c0;
  Matrix *local_2b8;
  Matrix *result2;
  duration<double,_std::ratio<1L,_1L>_> local_2a8;
  duration<double,_std::ratio<1L,_1L>_> elapsed_seconds;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  start;
  TriangularSolve *rs2;
  string local_280;
  Matrix *local_260;
  Matrix *rhcr;
  CSR *ccf;
  CSC *H;
  ifstream local_238 [8];
  ifstream fin;
  string local_30 [8];
  string in_path_;
  string *f1_local;
  
  in_path_.field_2._8_8_ = f1;
  std::__cxx11::string::string(local_30,(string *)f1);
  std::ifstream::ifstream(local_238,local_30,_S_in);
  format::read_mtx_csc_real(local_238,(CSC **)&ccf,true);
  this = (CSR *)operator_new(0x30);
  CSR::CSR(this,ccf->nonzero,ccf->row,*(int *)&ccf->val,ccf->idx,ccf->nzRow,*(double **)(ccf + 1));
  rhcr = (Matrix *)this;
  CSR::turntoCSR(this);
  pMVar2 = (Matrix *)operator_new(0x30);
  rs2._6_1_ = 1;
  row = ccf->nonzero;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,"rhcr:",(allocator *)((long)&rs2 + 7));
  Matrix::Matrix(pMVar2,row,1,&local_280);
  rs2._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rs2 + 7));
  local_260 = pMVar2;
  Matrix::Random(pMVar2);
  this_00 = (TriangularSolve *)operator_new(4);
  TriangularSolve::TriangularSolve(this_00,ccf->nonzero);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&end);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&elapsed_seconds);
  result2 = (Matrix *)std::chrono::_V2::system_clock::now();
  end.__d.__r = (duration)(duration)result2;
  local_2b8 = TriangularSolve::solve(this_00,(CSR *)rhcr,local_260);
  local_2c0 = (rep_conflict)std::chrono::_V2::system_clock::now();
  elapsed_seconds.__r = local_2c0;
  durationSym = (double)std::chrono::operator-
                                  ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&elapsed_seconds,&end);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_2c8,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&durationSym);
  local_2a8.__r = local_2c8;
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_2a8);
  poVar3 = std::operator<<((ostream *)&std::cout,"execution time (CSR Solve):");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar4);
  std::operator<<(poVar3,"\n");
  pMVar2 = CSR::csrMult((CSR *)rhcr,local_2b8);
  Matrix::isequal(pMVar2,local_260);
  if (ccf != (CSR *)0x0) {
    format::CSC::~CSC((CSC *)ccf);
    operator_delete(ccf,0x38);
  }
  pMVar1 = rhcr;
  if (rhcr != (Matrix *)0x0) {
    CSR::~CSR((CSR *)rhcr);
    operator_delete(pMVar1,0x30);
  }
  pMVar1 = local_260;
  if (local_260 != (Matrix *)0x0) {
    Matrix::~Matrix(local_260);
    operator_delete(pMVar1,0x30);
  }
  if (this_00 != (TriangularSolve *)0x0) {
    TriangularSolve::~TriangularSolve(this_00);
    operator_delete(this_00,4);
  }
  pMVar1 = local_2b8;
  if (local_2b8 != (Matrix *)0x0) {
    Matrix::~Matrix(local_2b8);
    operator_delete(pMVar1,0x30);
  }
  if (pMVar2 != (Matrix *)0x0) {
    Matrix::~Matrix(pMVar2);
    operator_delete(pMVar2,0x30);
  }
  std::ifstream::~ifstream(local_238);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void  csrFileTest(string f1)
{

    //sparse matrix file(csc)
    // std::string in_path_ = "D:\\github\\Axb\\sympiler\\LFAT5.mtx";
    // std::string in_path_ = "D:\\github\\Axb\\sympiler\\bcsstk01.mtx";
    std::string in_path_ = f1;
    std::ifstream fin(in_path_);
    format::CSC *H;
    read_mtx_csc_real(fin, H, true);

    //print of csc file
    CSR *ccf = new CSR(H->n, H->m, H->nnz, H->p, H->i, H->x);
    //ccf->triplet();

    //turn to csr
    // cout<<"CSR:"<<"\n";
    ccf->turntoCSR();
    // ccf->triplet();

    //csc file Solve
    Matrix *rhcr = new Matrix(H->n,1,"rhcr:");
    rhcr->Random();
    // rhcr->print();
    TriangularSolve *rs2 = new TriangularSolve(H->n);
    //time
    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    start = std::chrono::system_clock::now();
    Matrix *result2 = rs2->solve( ccf, rhcr);
    end = std::chrono::system_clock::now();
    elapsed_seconds = end - start;
    double durationSym = elapsed_seconds.count();
    cout << "execution time (CSR Solve):" << durationSym << "\n";
    //result2->print();

    //csr Solve,Test the equation(ccf*y=rhcr)
    Matrix *rs3 = ccf->csrMult(result2);
    //  rs3->print();
    bool r2 = rs3->isequal(rhcr);
    // cout<<"the result of Triangular solve is(CSR): "<<r2 <<"\n";

    //multiply of csc(file) and vector(file)
    //Matrix *mf = cf->turnToRegular();
    // mf->print();
    //Matrix *vf = cf->csrMult();
    //  vf->print();

    delete H;
    delete ccf;
    delete rhcr;
    delete rs2;
    delete result2;
    delete rs3;

}